

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O3

void usage(void)

{
  fprintf(_stderr,
          "\npigpio V%d\nUsage: sudo pigpiod [OPTION] ...\n   -a value,   DMA mode, 0=AUTO, 1=PMAP, 2=MBOX,  default AUTO\n   -b value,   sample buffer size in ms,          default 120\n   -c value,   library internal settings,         default 0\n   -d value,   primary DMA channel, 0-14,         default 14\n   -e value,   secondary DMA channel, 0-14,       default 6\n   -f,         disable fifo interface,            default enabled\n   -g,         run in foreground (do not fork),   default disabled\n   -k,         disable socket interface,          default enabled\n   -l,         localhost socket only              default local+remote\n   -m,         disable alerts                     default enabled\n   -n IP addr, allow address, name or dotted,     default allow all\n   -p value,   socket port, 1024-32000,           default 8888\n   -s value,   sample rate, 1, 2, 4, 5, 8, or 10, default 5\n   -t value,   clock peripheral, 0=PWM 1=PCM,     default PCM\n   -v, -V,     display pigpio version and exit\n   -x mask,    GPIO which may be updated,         default board GPIO\nEXAMPLE\nsudo pigpiod -s 2 -b 200 -f\n  Set a sample rate of 2 microseconds with a 200 millisecond\n  buffer.  Disable the fifo interface.\n\n"
          ,0x49);
  return;
}

Assistant:

void usage()
{
   fprintf(stderr, "\n" \
      "pigpio V%d\n" \
      "Usage: sudo pigpiod [OPTION] ...\n" \
      "   -a value,   DMA mode, 0=AUTO, 1=PMAP, 2=MBOX,  default AUTO\n" \
      "   -b value,   sample buffer size in ms,          default 120\n" \
      "   -c value,   library internal settings,         default 0\n" \
      "   -d value,   primary DMA channel, 0-14,         default 14\n" \
      "   -e value,   secondary DMA channel, 0-14,       default 6\n" \
      "   -f,         disable fifo interface,            default enabled\n" \
      "   -g,         run in foreground (do not fork),   default disabled\n" \
      "   -k,         disable socket interface,          default enabled\n" \
      "   -l,         localhost socket only              default local+remote\n" \
      "   -m,         disable alerts                     default enabled\n" \
      "   -n IP addr, allow address, name or dotted,     default allow all\n" \
      "   -p value,   socket port, 1024-32000,           default 8888\n" \
      "   -s value,   sample rate, 1, 2, 4, 5, 8, or 10, default 5\n" \
      "   -t value,   clock peripheral, 0=PWM 1=PCM,     default PCM\n" \
      "   -v, -V,     display pigpio version and exit\n" \
      "   -x mask,    GPIO which may be updated,         default board GPIO\n" \
      "EXAMPLE\n" \
      "sudo pigpiod -s 2 -b 200 -f\n" \
      "  Set a sample rate of 2 microseconds with a 200 millisecond\n" \
      "  buffer.  Disable the fifo interface.\n" \
   "\n", PIGPIO_VERSION);
}